

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<const_QWidget_*>::remove(QList<const_QWidget_*> *this,char *__filename)

{
  QList<const_QWidget_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QWidget **in_stack_00000018;
  QPodArrayOps<const_QWidget_*> *in_stack_00000020;
  QArrayDataPointer<const_QWidget_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<const_QWidget_*>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<const_QWidget_*>::operator->(&this->d);
    QArrayDataPointer<const_QWidget_*>::operator->(&this->d);
    QArrayDataPointer<const_QWidget_*>::begin((QArrayDataPointer<const_QWidget_*> *)0x4da4a9);
    QtPrivate::QPodArrayOps<const_QWidget_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}